

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O0

ULONG __thiscall Diligent::anon_unknown_0::DxcBlobWrapper::Release(DxcBlobWrapper *this)

{
  long lVar1;
  atomic<long> *paVar2;
  ULONG UVar3;
  long RemainingRefs;
  DxcBlobWrapper *this_local;
  
  paVar2 = &this->m_RefCount;
  LOCK();
  lVar1 = (paVar2->super___atomic_base<long>)._M_i;
  (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  UVar3 = lVar1 - 1;
  if ((UVar3 == 0) && (this != (DxcBlobWrapper *)0x0)) {
    ~DxcBlobWrapper(this);
    ::operator_delete(this,0x18);
  }
  return UVar3;
}

Assistant:

Release(void) override final
    {
        long RemainingRefs = m_RefCount.fetch_add(-1) - 1;
        if (RemainingRefs == 0)
            delete this;

        return RemainingRefs;
    }